

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRandomUniformBlockCase.cpp
# Opt level: O2

void __thiscall
vkt::ubo::RandomUniformBlockCase::generateUniform
          (RandomUniformBlockCase *this,Random *rnd,UniformBlock *block)

{
  uint uVar1;
  deUint32 flags;
  int in_R8D;
  float fVar2;
  float fVar3;
  VarType type;
  string name;
  Uniform local_68;
  
  uVar1 = this->m_features;
  ubo::(anonymous_namespace)::genName_abi_cxx11_
            (&name,(_anonymous_namespace_ *)0x61,'z',(char)this->m_uniformNdx,in_R8D);
  flags = 0;
  generateType(&type,this,rnd,0,true);
  if ((uVar1 >> 9 & 1) != 0) {
    fVar2 = deRandom_getFloat(&rnd->m_rnd);
    fVar3 = deRandom_getFloat(&rnd->m_rnd);
    flags = (uint)(fVar3 < 0.15) << 0xc | (uint)(fVar2 < 0.15) << 0xb;
  }
  Uniform::Uniform(&local_68,&name,&type,flags);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back
            (&block->m_uniforms,&local_68);
  Uniform::~Uniform(&local_68);
  this->m_uniformNdx = this->m_uniformNdx + 1;
  VarType::~VarType(&type);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void RandomUniformBlockCase::generateUniform (de::Random& rnd, UniformBlock& block)
{
	const float		unusedVtxWeight		= 0.15f;
	const float		unusedFragWeight	= 0.15f;
	bool			unusedOk			= (m_features & FEATURE_UNUSED_UNIFORMS) != 0;
	deUint32		flags				= 0;
	std::string		name				= genName('a', 'z', m_uniformNdx);
	VarType			type				= generateType(rnd, 0, true);

	flags |= (unusedOk && rnd.getFloat() < unusedVtxWeight)		? UNUSED_VERTEX		: 0;
	flags |= (unusedOk && rnd.getFloat() < unusedFragWeight)	? UNUSED_FRAGMENT	: 0;

	block.addUniform(Uniform(name, type, flags));

	m_uniformNdx += 1;
}